

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_minimize_assumptions(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar5 = (ulong)(uint)nLits;
LAB_005504ec:
  while( true ) {
    while( true ) {
      iVar7 = (int)uVar5;
      if (iVar7 == 1) {
        if (nConfLimit != 0) {
          s->nConfLimit = (long)nConfLimit + (s->stats).conflicts;
        }
        iVar7 = sat_solver_solve_internal(s);
        return (uint)(iVar7 != -1);
      }
      if (iVar7 < 2) {
        __assert_fail("nLits >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                      ,0x8ab,"int sat_solver_minimize_assumptions(sat_solver *, int *, int, int)");
      }
      uVar5 = uVar5 >> 1;
      iVar8 = (int)uVar5;
      iVar6 = 1;
      uVar11 = 0;
      do {
        iVar2 = sat_solver_push(s,pLits[uVar11]);
        if (iVar2 == 0) goto LAB_005506f4;
        uVar11 = uVar11 + 1;
        iVar6 = iVar6 + 1;
      } while (uVar5 != uVar11);
      if (nConfLimit != 0) {
        s->nConfLimit = (long)nConfLimit + (s->stats).conflicts;
      }
      iVar6 = sat_solver_solve_internal(s);
      if (iVar6 != -1) break;
      iVar8 = iVar8 + (uint)(iVar8 == 0);
      do {
        sat_solver_pop(s);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    uVar3 = 1;
    if (iVar7 - iVar8 != 1) {
      uVar3 = sat_solver_minimize_assumptions(s,pLits + uVar5,iVar7 - iVar8,nConfLimit);
    }
    iVar7 = iVar8 + (uint)(iVar8 == 0);
    do {
      sat_solver_pop(s);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    if ((s->temp_clause).size < 0) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->temp_clause).size = 0;
    uVar10 = (ulong)(iVar8 + (uint)(iVar8 == 0));
    uVar11 = 0;
    do {
      iVar7 = pLits[uVar11];
      uVar9 = (s->temp_clause).cap;
      if ((s->temp_clause).size == uVar9) {
        iVar6 = (uVar9 >> 1) * 3;
        if ((int)uVar9 < 4) {
          iVar6 = uVar9 * 2;
        }
        piVar4 = (s->temp_clause).ptr;
        if (piVar4 == (int *)0x0) {
          piVar4 = (int *)malloc((long)iVar6 << 2);
        }
        else {
          piVar4 = (int *)realloc(piVar4,(long)iVar6 << 2);
        }
        (s->temp_clause).ptr = piVar4;
        if (piVar4 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar6 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_clause).cap = iVar6;
      }
      iVar6 = (s->temp_clause).size;
      (s->temp_clause).size = iVar6 + 1;
      (s->temp_clause).ptr[iVar6] = iVar7;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    if (0 < (int)uVar3) {
      uVar11 = 0;
      do {
        pLits[uVar11] = pLits[uVar5 + uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    piVar4 = (s->temp_clause).ptr;
    uVar5 = 0;
    do {
      (pLits + (int)uVar3)[uVar5] = piVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
    if ((int)uVar3 < 1) break;
    iVar7 = 1;
    uVar5 = 0;
    while (iVar6 = sat_solver_push(s,pLits[uVar5]), iVar6 != 0) {
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 1;
      if (uVar3 == uVar5) goto LAB_00550745;
    }
    do {
      sat_solver_pop(s);
      iVar6 = iVar7 + -1;
      bVar1 = 0 < iVar7;
      iVar7 = iVar6;
    } while (iVar6 != 0 && bVar1);
    uVar5 = (ulong)((int)uVar5 + 1);
  }
LAB_00550745:
  if (nConfLimit != 0) {
    s->nConfLimit = (long)nConfLimit + (s->stats).conflicts;
  }
  iVar7 = sat_solver_solve_internal(s);
  if (iVar7 != -1) {
    iVar7 = 1;
    if (iVar8 != 1) {
      iVar7 = sat_solver_minimize_assumptions(s,pLits + (int)uVar3,iVar8,nConfLimit);
    }
    uVar9 = uVar3;
    if (0 < (int)uVar3) {
      do {
        sat_solver_pop(s);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    return uVar3 + iVar7;
  }
  uVar9 = uVar3;
  if ((int)uVar3 < 1) {
    return uVar3;
  }
  do {
    sat_solver_pop(s);
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
  return uVar3;
LAB_005506f4:
  do {
    sat_solver_pop(s);
    iVar7 = iVar6 + -1;
    bVar1 = 0 < iVar6;
    iVar6 = iVar7;
  } while (iVar7 != 0 && bVar1);
  uVar5 = (ulong)((int)uVar11 + 1);
  goto LAB_005504ec;
}

Assistant:

int sat_solver_minimize_assumptions( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR, status;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
        status = sat_solver_solve_internal( s );
        //printf( "%c", status == l_False ? 'u' : 's' );
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nLitsL; i++ )
            sat_solver_pop(s);
        return sat_solver_minimize_assumptions( s, pLits, nLitsL, nConfLimit );
    }
    // solve for the right lits
    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nResL; i++ )
            sat_solver_pop(s);
        return nResL;
    }
    // solve for the left lits
    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}